

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environment.cpp
# Opt level: O0

void __thiscall
Environment::putValue
          (Environment *this,Identifier *ident,Scope scope,ptr<Value> *value,bool constant)

{
  mapped_type *this_00;
  shared_ptr<Member> local_a0 [2];
  Identifier local_80;
  undefined1 local_60 [8];
  Symbol symbol;
  bool constant_local;
  ptr<Value> *value_local;
  Scope scope_local;
  Identifier *ident_local;
  Environment *this_local;
  
  symbol.scope._3_1_ = constant;
  std::__cxx11::string::string((string *)&local_80,(string *)ident);
  Symbol::Symbol((Symbol *)local_60,&local_80,(bool)(symbol.scope._3_1_ & 1),scope);
  std::__cxx11::string::~string((string *)&local_80);
  std::dynamic_pointer_cast<Member,Value>((shared_ptr<Value> *)local_a0);
  this_00 = std::
            unordered_map<Symbol,_std::shared_ptr<Member>,_SymbolHashFunction,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>_>
            ::operator[](&this->symbols,(key_type *)local_60);
  std::shared_ptr<Member>::operator=(this_00,local_a0);
  std::shared_ptr<Member>::~shared_ptr(local_a0);
  Symbol::~Symbol((Symbol *)local_60);
  return;
}

Assistant:

void Environment::putValue(const Identifier &ident, Scope scope, ptr<Value> value, bool constant) {
    Symbol symbol(ident, constant, scope);
    symbols[symbol] = std::dynamic_pointer_cast<Member>(value);
}